

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CBillboardSceneNode::updateMesh(CBillboardSceneNode *this,ICameraSceneNode *camera)

{
  undefined8 *puVar1;
  S3DVertex *pSVar2;
  long *in_RSI;
  long *in_RDI;
  float fVar3;
  vector3d<float> vVar4;
  s32 i;
  array<irr::video::S3DVertex> *vertices;
  vector3df vertical;
  vector3df topHorizontal;
  vector3df horizontal;
  vector3df view;
  vector3df up;
  vector3df target;
  vector3df campos;
  vector3df pos;
  u32 in_stack_fffffffffffffdac;
  array<irr::video::S3DVertex> *in_stack_fffffffffffffdb0;
  array<irr::video::S3DVertex> *this_00;
  vector3d<float> *in_stack_fffffffffffffdb8;
  vector3d<float> *other;
  vector3d<float> *in_stack_fffffffffffffdc0;
  vector3d<float> *this_01;
  undefined8 local_210;
  float local_208;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_198;
  float local_190;
  undefined8 local_158;
  float local_150;
  int local_11c;
  vector3d<float> local_110;
  vector3d<float> local_fc;
  vector3d<float> local_f0;
  vector3d<float> local_e0;
  undefined8 local_d0;
  float local_c8;
  undefined1 local_c0 [16];
  vector3d<float> local_b0;
  pointer local_9c;
  float local_94;
  vector3d<float> local_90;
  vector3d<float> local_80;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_40;
  vector3d<float> local_30;
  vector3d<float> local_20;
  long *local_10;
  
  local_10 = in_RSI;
  local_30._0_8_ =
       (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) + 0xe8))
                 ((long)in_RDI + *(long *)(*in_RDI + -0x18));
  local_20._0_8_ = local_30._0_8_;
  local_50 = (**(code **)(*local_10 + 0xe8))();
  local_40 = local_50;
  puVar1 = (undefined8 *)(**(code **)(*local_10 + 0x158))();
  local_58 = *(undefined4 *)(puVar1 + 1);
  local_60 = *puVar1;
  puVar1 = (undefined8 *)(**(code **)(*local_10 + 0x168))();
  local_68 = *(float *)(puVar1 + 1);
  local_70 = *puVar1;
  vVar4 = core::vector3d<float>::operator-(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_90.Z = vVar4.Z;
  local_80.Z = local_90.Z;
  local_90._0_8_ = vVar4._0_8_;
  local_80.X = local_90.X;
  local_80.Y = local_90.Y;
  local_90 = vVar4;
  core::vector3d<float>::normalize(in_stack_fffffffffffffdb8);
  local_b0 = core::vector3d<float>::crossProduct
                       (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_9c = (pointer)local_b0._0_8_;
  local_94 = local_b0.Z;
  fVar3 = core::vector3d<float>::getLength((vector3d<float> *)0x2f026a);
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    core::vector3d<float>::set((vector3d<float> *)&local_9c,local_70._4_4_,(float)local_70,local_68)
    ;
  }
  core::vector3d<float>::normalize(in_stack_fffffffffffffdb8);
  vVar4 = core::vector3d<float>::operator*
                    (in_stack_fffffffffffffdc0,(float)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  local_e0.Z = vVar4.Z;
  local_c8 = local_e0.Z;
  local_e0._0_8_ = vVar4._0_8_;
  local_d0._0_4_ = local_e0.X;
  local_d0._4_4_ = local_e0.Y;
  local_e0 = vVar4;
  vVar4 = core::vector3d<float>::operator*
                    (in_stack_fffffffffffffdc0,(float)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  local_f0.Z = vVar4.Z;
  local_c0._8_4_ = local_f0.Z;
  local_f0._0_8_ = vVar4._0_8_;
  local_c0._0_4_ = local_f0.X;
  local_c0._4_4_ = local_f0.Y;
  local_f0 = vVar4;
  core::vector3d<float>::operator*=((vector3d<float> *)&local_9c,*(float *)(in_RDI + 1) * 0.5);
  vVar4 = core::vector3d<float>::crossProduct(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_110._0_8_ = vVar4._0_8_;
  local_fc.X = local_110.X;
  local_fc.Y = local_110.Y;
  local_110.Z = vVar4.Z;
  local_fc.Z = local_110.Z;
  core::vector3d<float>::normalize(in_stack_fffffffffffffdb8);
  core::vector3d<float>::operator*=(&local_fc,*(float *)((long)in_RDI + 0xc) * 0.5);
  core::vector3d<float>::operator*=(&local_80,-1.0);
  for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
    pSVar2 = core::array<irr::video::S3DVertex>::operator[]
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    (pSVar2->Normal).X = local_80.X;
    (pSVar2->Normal).Y = local_80.Y;
    (pSVar2->Normal).Z = local_80.Z;
  }
  other = &local_20;
  this_01 = (vector3d<float> *)&local_9c;
  core::vector3d<float>::operator+(this_01,other);
  vVar4 = core::vector3d<float>::operator+(this_01,other);
  local_150 = vVar4.Z;
  local_158 = vVar4._0_8_;
  pSVar2 = core::array<irr::video::S3DVertex>::operator[]
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  (pSVar2->Pos).Z = local_150;
  (pSVar2->Pos).X = (float)(undefined4)local_158;
  (pSVar2->Pos).Y = (float)local_158._4_4_;
  this_00 = (array<irr::video::S3DVertex> *)local_c0;
  core::vector3d<float>::operator+(this_01,other);
  vVar4 = core::vector3d<float>::operator-(this_01,other);
  local_190 = vVar4.Z;
  local_198 = vVar4._0_8_;
  pSVar2 = core::array<irr::video::S3DVertex>::operator[](this_00,in_stack_fffffffffffffdac);
  (pSVar2->Pos).Z = local_190;
  (pSVar2->Pos).X = (float)(undefined4)local_198;
  (pSVar2->Pos).Y = (float)local_198._4_4_;
  core::vector3d<float>::operator-(this_01,other);
  vVar4 = core::vector3d<float>::operator-(this_01,other);
  local_1d0 = vVar4.Z;
  local_1d8 = vVar4._0_8_;
  pSVar2 = core::array<irr::video::S3DVertex>::operator[](this_00,in_stack_fffffffffffffdac);
  (pSVar2->Pos).Z = local_1d0;
  (pSVar2->Pos).X = (float)(undefined4)local_1d8;
  (pSVar2->Pos).Y = (float)local_1d8._4_4_;
  core::vector3d<float>::operator-(this_01,other);
  vVar4 = core::vector3d<float>::operator+(this_01,other);
  local_210 = vVar4._0_8_;
  local_208 = vVar4.Z;
  pSVar2 = core::array<irr::video::S3DVertex>::operator[](this_00,in_stack_fffffffffffffdac);
  (pSVar2->Pos).X = (float)(undefined4)local_210;
  (pSVar2->Pos).Y = (float)local_210._4_4_;
  (pSVar2->Pos).Z = local_208;
  (**(code **)(*(long *)in_RDI[6] + 0xb8))((long *)in_RDI[6],1);
  (**(code **)(*(long *)in_RDI[6] + 0x60))();
  return;
}

Assistant:

void CBillboardSceneNode::updateMesh(const irr::scene::ICameraSceneNode *camera)
{
	// billboard looks toward camera
	core::vector3df pos = getAbsolutePosition();

	core::vector3df campos = camera->getAbsolutePosition();
	core::vector3df target = camera->getTarget();
	core::vector3df up = camera->getUpVector();
	core::vector3df view = target - campos;
	view.normalize();

	core::vector3df horizontal = up.crossProduct(view);
	if (horizontal.getLength() == 0) {
		horizontal.set(up.Y, up.X, up.Z);
	}
	horizontal.normalize();
	core::vector3df topHorizontal = horizontal * 0.5f * TopEdgeWidth;
	horizontal *= 0.5f * Size.Width;

	// pointing down!
	core::vector3df vertical = horizontal.crossProduct(view);
	vertical.normalize();
	vertical *= 0.5f * Size.Height;

	view *= -1.0f;

	core::array<video::S3DVertex> &vertices = Buffer->Vertices;

	for (s32 i = 0; i < 4; ++i)
		vertices[i].Normal = view;

	/* Vertices are:
	2--1
	|\ |
	| \|
	3--0
	*/
	vertices[0].Pos = pos + horizontal + vertical;
	vertices[1].Pos = pos + topHorizontal - vertical;
	vertices[2].Pos = pos - topHorizontal - vertical;
	vertices[3].Pos = pos - horizontal + vertical;

	Buffer->setDirty(EBT_VERTEX);
	Buffer->recalculateBoundingBox();
}